

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::hkdf_hmac_sha256_l32_tests::test_method(hkdf_hmac_sha256_l32_tests *this)

{
  long lVar1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  allocator<char> *in_stack_fffffffffffffe18;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe20;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_194;
  allocator<char> local_193;
  allocator<char> local_192;
  allocator<char> local_191;
  allocator<char> local_190;
  allocator<char> local_18f;
  allocator<char> local_18e;
  allocator<char> local_18d;
  allocator<char> local_18c;
  allocator<char> local_18b;
  allocator<char> local_18a;
  allocator<char> local_189 [9];
  string *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  CryptoTest *in_stack_fffffffffffffea0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_18c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  CryptoTest::TestHKDF_SHA256_32
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (string *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_18c);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_18b);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_18a);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(local_189);
  __s = &local_18d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffe18);
  __a = &local_18e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CryptoTest::TestHKDF_SHA256_32
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (string *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_190);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_18f);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_18e);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_18d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CryptoTest::TestHKDF_SHA256_32
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (string *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_194);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_193);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_192);
  std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
  std::allocator<char>::~allocator(&local_191);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(hkdf_hmac_sha256_l32_tests)
{
    // Use rfc5869 test vectors but truncated to 32 bytes (our implementation only support length 32)
    TestHKDF_SHA256_32(
                /*ikm_hex=*/"0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b",
                /*salt_hex=*/"000102030405060708090a0b0c",
                /*info_hex=*/"f0f1f2f3f4f5f6f7f8f9",
                /*okm_check_hex=*/"3cb25f25faacd57a90434f64d0362f2a2d2d0a90cf1a5a4c5db02d56ecc4c5bf");
    TestHKDF_SHA256_32(
                "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f202122232425262728292a2b2c2d2e2f303132333435363738393a3b3c3d3e3f404142434445464748494a4b4c4d4e4f",
                "606162636465666768696a6b6c6d6e6f707172737475767778797a7b7c7d7e7f808182838485868788898a8b8c8d8e8f909192939495969798999a9b9c9d9e9fa0a1a2a3a4a5a6a7a8a9aaabacadaeaf",
                "b0b1b2b3b4b5b6b7b8b9babbbcbdbebfc0c1c2c3c4c5c6c7c8c9cacbcccdcecfd0d1d2d3d4d5d6d7d8d9dadbdcdddedfe0e1e2e3e4e5e6e7e8e9eaebecedeeeff0f1f2f3f4f5f6f7f8f9fafbfcfdfeff",
                "b11e398dc80327a1c8e7f78c596a49344f012eda2d4efad8a050cc4c19afa97c");
    TestHKDF_SHA256_32(
                "0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b",
                "",
                "",
                "8da4e775a563c18f715f802a063c5a31b8a11f5c5ee1879ec3454e5f3c738d2d");
}